

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalArgMinMax<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  string *this_00;
  reference pvVar1;
  pointer pEVar2;
  reference pvVar3;
  CastFunctionSet *this_01;
  ulong uVar4;
  LogicalType *type;
  LogicalType *__n;
  idx_t i;
  LogicalType *__n_00;
  LogicalType by_type;
  LogicalType decimal_type;
  vector<duckdb::LogicalType,_true> by_types;
  type name;
  AggregateFunction local_160;
  
  type = (LogicalType *)arguments;
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  LogicalType::LogicalType(&decimal_type,&pEVar2->return_type);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  LogicalType::LogicalType(&by_type,&pEVar2->return_type);
  ArgMaxByTypes();
  __n = (LogicalType *)0xffffffffffffffff;
  for (__n_00 = (LogicalType *)0x0;
      __n_00 < (LogicalType *)
               (((long)by_types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)by_types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n_00 = (LogicalType *)&__n_00->physical_type_) {
    pvVar3 = vector<duckdb::LogicalType,_true>::get<true>(&by_types,(size_type)__n_00);
    if (pvVar3->physical_type_ == by_type.physical_type_) goto LAB_00ae748b;
    this_01 = CastFunctionSet::Get(context);
    pvVar3 = vector<duckdb::LogicalType,_true>::get<true>(&by_types,(size_type)__n_00);
    uVar4 = CastFunctionSet::ImplicitCastCost(this_01,&by_type,pvVar3);
    type = __n;
    if (uVar4 < 0x7fffffffffffffff) {
      type = __n_00;
    }
    if (-1 < (long)uVar4) {
      __n = type;
    }
  }
  if (__n != (LogicalType *)0xffffffffffffffff) {
    pvVar3 = vector<duckdb::LogicalType,_true>::get<true>(&by_types,(size_type)__n);
    LogicalType::operator=(&by_type,pvVar3);
  }
LAB_00ae748b:
  this_00 = &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name;
  ::std::__cxx11::string::string((string *)&name,(string *)this_00);
  if (decimal_type.physical_type_ == INT64) {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,long>
              (&local_160,(duckdb *)&by_type,&decimal_type,type);
  }
  else if (decimal_type.physical_type_ == INT32) {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,int>
              (&local_160,(duckdb *)&by_type,&decimal_type,type);
  }
  else if (decimal_type.physical_type_ == INT16) {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,short>
              (&local_160,(duckdb *)&by_type,&decimal_type,type);
  }
  else {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::hugeint_t>
              (&local_160,(duckdb *)&by_type,&decimal_type,type);
  }
  AggregateFunction::operator=(function,&local_160);
  AggregateFunction::~AggregateFunction(&local_160);
  ::std::__cxx11::string::operator=((string *)this_00,(string *)&name);
  LogicalType::operator=(&(function->super_BaseScalarFunction).return_type,&decimal_type);
  *(undefined8 *)this = 0;
  ::std::__cxx11::string::~string((string *)&name);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&by_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  LogicalType::~LogicalType(&by_type);
  LogicalType::~LogicalType(&decimal_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> BindDecimalArgMinMax(ClientContext &context, AggregateFunction &function,
                                                     vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	auto by_type = arguments[1]->return_type;

	// To avoid a combinatorial explosion, cast the ordering argument to one from the list
	auto by_types = ArgMaxByTypes();
	idx_t best_target = DConstants::INVALID_INDEX;
	int64_t lowest_cost = NumericLimits<int64_t>::Maximum();
	for (idx_t i = 0; i < by_types.size(); ++i) {
		// Before falling back to casting, check for a physical type match for the by_type
		if (by_types[i].InternalType() == by_type.InternalType()) {
			lowest_cost = 0;
			best_target = DConstants::INVALID_INDEX;
			break;
		}

		auto cast_cost = CastFunctionSet::Get(context).ImplicitCastCost(by_type, by_types[i]);
		if (cast_cost < 0) {
			continue;
		}
		if (cast_cost < lowest_cost) {
			best_target = i;
		}
	}

	if (best_target != DConstants::INVALID_INDEX) {
		by_type = by_types[best_target];
	}

	auto name = std::move(function.name);
	function = GetDecimalArgMinMaxFunction<OP>(by_type, decimal_type);
	function.name = std::move(name);
	function.return_type = decimal_type;
	return nullptr;
}